

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorUtils.cpp
# Opt level: O0

void __thiscall HFactor::reportLu(HFactor *this,HighsInt l_u_or_both,bool full)

{
  string *psVar1;
  const_reference pvVar2;
  uint *puVar3;
  const_reference pvVar4;
  byte in_DL;
  uint in_ESI;
  long in_RDI;
  HighsInt iEl_1;
  HighsInt iEl;
  HighsInt end;
  HighsInt start;
  size_t iRow;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff950;
  allocator *this_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff960;
  allocator *entry;
  string *in_stack_fffffffffffff968;
  HFactor *in_stack_fffffffffffff970;
  allocator *in_stack_fffffffffffff988;
  allocator *in_stack_fffffffffffff990;
  allocator local_5d9;
  string local_5d8 [63];
  allocator local_599;
  string local_598 [63];
  allocator local_559;
  string local_558 [63];
  allocator local_519;
  string local_518 [63];
  allocator local_4d9;
  string local_4d8 [32];
  int local_4b8;
  int local_4b4;
  int local_4b0;
  int local_4ac;
  string *local_4a8;
  undefined1 local_481 [64];
  allocator local_441;
  string local_440 [63];
  allocator local_401;
  string local_400 [63];
  allocator local_3c1;
  string local_3c0 [63];
  allocator local_381;
  string local_380 [63];
  allocator local_341;
  string local_340 [63];
  allocator local_301;
  string local_300 [63];
  allocator local_2c1;
  string local_2c0 [63];
  allocator local_281;
  string local_280 [63];
  allocator local_241;
  string local_240 [63];
  allocator local_201;
  string local_200 [63];
  allocator local_1c1;
  string local_1c0 [63];
  allocator local_181;
  string local_180 [63];
  allocator local_141;
  string local_140 [63];
  allocator local_101;
  string local_100 [63];
  allocator local_c1;
  string local_c0 [63];
  allocator local_81;
  string local_80 [79];
  allocator local_31;
  string local_30 [35];
  byte local_d;
  uint local_c;
  
  local_d = in_DL & 1;
  if ((0 < (int)in_ESI) && ((int)in_ESI < 4)) {
    local_c = in_ESI;
    if ((in_ESI & 1) != 0) {
      printf("L");
      if ((local_d & 1) != 0) {
        printf(" - full");
      }
      printf(":\n");
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_30,"l_pivot_lookup",&local_31);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_30);
        std::allocator<char>::~allocator((allocator<char> *)&local_31);
      }
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"l_pivot_index",&local_81);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"l_start",&local_c1);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"l_index",&local_101);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,"l_value",&local_141);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
      reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                         in_stack_fffffffffffff960);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"lr_start",&local_181);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c0,"lr_index",&local_1c1);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_200,"lr_value",&local_201);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                   (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
        reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                           in_stack_fffffffffffff960);
        std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_200);
        std::allocator<char>::~allocator((allocator<char> *)&local_201);
      }
    }
    if ((local_c & 2) != 0) {
      printf("U");
      if ((local_d & 1) != 0) {
        printf(" - full");
      }
      printf(":\n");
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"u_pivot_lookup",&local_241);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"u_pivot_index",&local_281);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,"u_pivot_value",&local_2c1);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
      reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                         in_stack_fffffffffffff960);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_2c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"u_start",&local_301);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_300);
      std::allocator<char>::~allocator((allocator<char> *)&local_301);
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_340,"u_last_p",&local_341);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
      }
      in_stack_fffffffffffff990 = &local_381;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_380,"u_index",in_stack_fffffffffffff990);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_380);
      std::allocator<char>::~allocator((allocator<char> *)&local_381);
      in_stack_fffffffffffff988 = &local_3c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3c0,"u_value",in_stack_fffffffffffff988);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
      reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                         in_stack_fffffffffffff960);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      if ((local_d & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_400,"ur_start",&local_401);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_400);
        std::allocator<char>::~allocator((allocator<char> *)&local_401);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_440,"ur_lastp",&local_441);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string(local_440);
        std::allocator<char>::~allocator((allocator<char> *)&local_441);
        in_stack_fffffffffffff970 = (HFactor *)local_481;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_481 + 1),"ur_space",(allocator *)in_stack_fffffffffffff970);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                   (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
        reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                        (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff960);
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
        std::__cxx11::string::~string((string *)(local_481 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_481);
        local_4a8 = (string *)0x0;
        while (in_stack_fffffffffffff968 = local_4a8,
              psVar1 = (string *)
                       std::vector<int,_std::allocator<int>_>::size
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8)),
              in_stack_fffffffffffff968 < psVar1) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),
                              (size_type)local_4a8);
          local_4ac = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5f0),
                              (size_type)local_4a8);
          local_4b0 = *pvVar2;
          if (local_4ac < local_4b0) {
            printf("UR    Row %2d: ",(ulong)local_4a8 & 0xffffffff);
            for (local_4b4 = local_4ac; local_4b4 < local_4b0; local_4b4 = local_4b4 + 1) {
              puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),
                                          (long)local_4b4);
              printf("%11d ",(ulong)*puVar3);
            }
            printf("\n              ");
            for (local_4b8 = local_4ac; local_4b8 < local_4b0; local_4b8 = local_4b8 + 1) {
              pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),
                                  (long)local_4b8);
              printf("%11.4g ",*pvVar4);
            }
            printf("\n");
          }
          local_4a8 = (string *)&local_4a8->field_0x1;
        }
      }
    }
    if ((local_c == 3) && ((local_d & 1) != 0)) {
      entry = &local_4d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d8,"pf_pivot_value",entry);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
      reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                         (vector<double,_std::allocator<double>_> *)entry);
      std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_518,"pf_pivot_index",&local_519);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)entry);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff950);
      std::__cxx11::string::~string(local_518);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      this_00 = &local_559;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_558,"pf_start",this_00);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)entry);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator((allocator<char> *)&local_559);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_598,"pf_index",&local_599);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff988);
      reportIntVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                      (vector<int,_std::allocator<int>_> *)entry);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5d8,"pf_value",&local_5d9);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff990,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff988);
      reportDoubleVector(in_stack_fffffffffffff970,in_stack_fffffffffffff968,
                         (vector<double,_std::allocator<double>_> *)entry);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)this_00);
      std::__cxx11::string::~string(local_5d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    }
  }
  return;
}

Assistant:

void HFactor::reportLu(const HighsInt l_u_or_both, const bool full) const {
  if (l_u_or_both < kReportLuJustL || l_u_or_both > kReportLuBoth) return;
  if (l_u_or_both & 1) {
    printf("L");
    if (full) printf(" - full");
    printf(":\n");

    if (full) reportIntVector("l_pivot_lookup", l_pivot_lookup);
    if (full) reportIntVector("l_pivot_index", l_pivot_index);
    reportIntVector("l_start", l_start);
    reportIntVector("l_index", l_index);
    reportDoubleVector("l_value", l_value);
    if (full) {
      reportIntVector("lr_start", lr_start);
      reportIntVector("lr_index", lr_index);
      reportDoubleVector("lr_value", lr_value);
    }
  }
  if (l_u_or_both & 2) {
    printf("U");
    if (full) printf(" - full");
    printf(":\n");
    if (full) reportIntVector("u_pivot_lookup", u_pivot_lookup);
    reportIntVector("u_pivot_index", u_pivot_index);
    reportDoubleVector("u_pivot_value", u_pivot_value);
    reportIntVector("u_start", u_start);
    if (full) reportIntVector("u_last_p", u_last_p);
    reportIntVector("u_index", u_index);
    reportDoubleVector("u_value", u_value);
    if (full) {
      reportIntVector("ur_start", ur_start);
      reportIntVector("ur_lastp", ur_lastp);
      reportIntVector("ur_space", ur_space);
      for (size_t iRow = 0; iRow < ur_start.size(); iRow++) {
        const HighsInt start = ur_start[iRow];
        const HighsInt end = ur_lastp[iRow];
        if (start >= end) continue;
        printf("UR    Row %2d: ", (int)iRow);
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11d ", (int)ur_index[iEl]);
        printf("\n              ");
        for (HighsInt iEl = start; iEl < end; iEl++)
          printf("%11.4g ", ur_value[iEl]);
        printf("\n");
      }
      //      reportIntVector("ur_index", ur_index);
      //      reportDoubleVector("ur_value", ur_value);
    }
  }
  if (l_u_or_both == 3 && full) {
    reportDoubleVector("pf_pivot_value", pf_pivot_value);
    reportIntVector("pf_pivot_index", pf_pivot_index);
    reportIntVector("pf_start", pf_start);
    reportIntVector("pf_index", pf_index);
    reportDoubleVector("pf_value", pf_value);
  }
}